

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

Result __thiscall
soplex::SPxMainSM<double>::duplicateRows(SPxMainSM<double> *this,SPxLPBase<double> *lp,bool *again)

{
  double dVar1;
  double dVar2;
  SPxOut *pSVar3;
  uint uVar4;
  bool bVar5;
  Result RVar6;
  int iVar7;
  int iVar8;
  Verbosity VVar9;
  int *piVar10;
  double *pdVar11;
  char *pcVar12;
  SPxSense *pSVar13;
  DSVectorBase<double> *pDVar14;
  element_type *peVar15;
  bool *pbVar16;
  SVectorBase<double> *pSVar17;
  ulong *puVar18;
  int __c;
  int __c_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  int __c_06;
  undefined1 *in_RDX;
  DSVectorBase<double> *in_RSI;
  SPxMainSM<double> *in_RDI;
  Real eps;
  Verbosity old_verbosity_1;
  int i_6;
  int i_5;
  int *perm;
  int nRowsOld;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr_1;
  DataArray<int> da_perm_empty;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr;
  int j_2;
  DataArray<int> da_perm;
  double newRhs;
  double newLhs;
  double factor;
  double scaledRhs;
  double scaledLhs;
  int i_4;
  int l_2;
  DataArray<bool> isLhsEqualRhs;
  double minRhs;
  double maxLhs;
  int minRhsIdx;
  int maxLhsIdx;
  int rowIdx;
  int k_5;
  VectorBase<double> newRhsVec;
  VectorBase<double> newLhsVec;
  bool doChangeRanges;
  int j_tmp;
  int k_tmp;
  int i_3;
  int l_1;
  int k_4;
  int numDelRows;
  int idxLastDupRows;
  int idxFirstDupRows;
  int j_1;
  int *perm_tmp;
  int nRowsOld_tmp;
  int k_3;
  int k_2;
  DataArray<bool> remRow;
  int l;
  int classIdx;
  ElementCompare compare;
  int k_1;
  int m;
  int i_2;
  double aij;
  int k;
  SVectorBase<double> *col;
  int j;
  double oldVal;
  int i_1;
  IdxSet idxSet;
  SPxMemoryException *x;
  int *idxMem;
  Array<double> scale;
  DataArray<int> classSize;
  DataArray<int> pClass;
  Verbosity old_verbosity;
  SVectorBase<double> *row;
  int i;
  int rs_remRows;
  Result ret;
  int oldRows;
  int remNzos;
  int remRows;
  DuplicateRowsPS *in_stack_fffffffffffff8a8;
  SPxLPBase<double> *in_stack_fffffffffffff8b0;
  DataArray<bool> *in_stack_fffffffffffff8b8;
  undefined4 in_stack_fffffffffffff8c0;
  undefined4 in_stack_fffffffffffff8c4;
  SPxMainSM<double> *in_stack_fffffffffffff8d0;
  SPxMainSM<double> *this_00;
  undefined4 in_stack_fffffffffffff8d8;
  int in_stack_fffffffffffff8dc;
  ElementCompare *in_stack_fffffffffffff8e0;
  undefined8 in_stack_fffffffffffff8e8;
  int n;
  Nonzero<double> *in_stack_fffffffffffff8f0;
  Real in_stack_fffffffffffff998;
  DSVectorBase<double> *in_stack_fffffffffffff9a0;
  int in_stack_fffffffffffff9ac;
  int in_stack_fffffffffffff9b0;
  int in_stack_fffffffffffff9b4;
  SPxLPBase<double> *in_stack_fffffffffffff9b8;
  DuplicateRowsPS *in_stack_fffffffffffff9c0;
  pointer in_stack_fffffffffffff9e0;
  DataArray<int> *in_stack_fffffffffffff9e8;
  DataArray<bool> *in_stack_fffffffffffff9f0;
  int in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa0c;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  SVectorBase<double> *in_stack_fffffffffffffa28;
  SPxLPBase<double> *in_stack_fffffffffffffa30;
  pointer pDVar19;
  SPxMainSM<double> *in_stack_fffffffffffffa38;
  pointer pDVar20;
  SPxLPBase<double> *in_stack_fffffffffffffa40;
  SPxMainSM<double> *in_stack_fffffffffffffa48;
  pointer local_5b0;
  pointer local_590;
  pointer local_570;
  pointer local_550;
  pointer local_530;
  undefined4 local_398;
  Verbosity local_394;
  int local_390;
  int local_38c;
  long local_388;
  int local_37c;
  int local_378;
  undefined1 local_371;
  undefined1 local_370 [56];
  undefined1 local_338 [95];
  undefined1 local_2d9;
  undefined1 local_2d8 [32];
  DataArray<bool> local_2b8;
  undefined1 local_2a0 [68];
  int local_25c;
  DataArray<int> local_258;
  pointer local_240;
  pointer local_238;
  pointer local_230;
  pointer local_228;
  pointer local_220;
  int local_218;
  uint local_214;
  DataArray<bool> local_210;
  pointer local_1f8;
  pointer local_1f0;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  undefined1 local_1d0 [24];
  undefined1 local_1b8 [27];
  byte local_19d;
  int local_19c;
  int local_198;
  int local_194;
  uint local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  int local_16c;
  pointer local_168;
  int local_160;
  int local_15c;
  DataArray<bool> local_158;
  uint local_140;
  int local_13c;
  ElementCompare local_128;
  SPxSense local_120;
  uint local_11c;
  double local_118;
  int local_10c;
  double local_108;
  uint local_fc;
  SPxScaler<double> *local_f8;
  int local_ec;
  element_type *local_e8;
  int local_dc;
  IdxSet local_d8;
  int *local_b0;
  DataArray<int> local_80;
  DataArray<int> local_68;
  undefined4 local_50;
  Verbosity local_4c;
  SVectorBase<double> *local_48;
  int local_40;
  int local_3c;
  undefined4 local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined1 *local_28;
  DSVectorBase<double> *local_20;
  Result local_c;
  
  local_2c = 0;
  local_30 = 0;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_34 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x274df3);
  RVar6 = removeEmpty(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  if (RVar6 == OKAY) {
    local_3c = 0;
    local_38 = 0;
    for (local_40 = 0; iVar8 = local_40,
        iVar7 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x274e64), iVar8 < iVar7;
        local_40 = local_40 + 1) {
      local_48 = SPxLPBase<double>::rowVector
                           (in_stack_fffffffffffff8b0,
                            (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
      iVar8 = SVectorBase<double>::size(local_48);
      if (iVar8 == 1) {
        removeRowSingleton(in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                           in_stack_fffffffffffffa28,
                           (int *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
        local_3c = local_3c + 1;
      }
    }
    if (((0 < local_3c) && ((in_RDI->super_SPxSimplifier<double>).spxout != (SPxOut *)0x0)) &&
       (VVar9 = SPxOut::getVerbosity((in_RDI->super_SPxSimplifier<double>).spxout), 3 < (int)VVar9))
    {
      local_4c = SPxOut::getVerbosity((in_RDI->super_SPxSimplifier<double>).spxout);
      pSVar3 = (in_RDI->super_SPxSimplifier<double>).spxout;
      local_50 = 4;
      (*pSVar3->_vptr_SPxOut[2])(pSVar3,&local_50);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff8b0,
                         (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff8b0,
                         (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffff8b0,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff8a8);
      pSVar3 = (in_RDI->super_SPxSimplifier<double>).spxout;
      (*pSVar3->_vptr_SPxOut[2])(pSVar3,&local_4c);
    }
    iVar8 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x274ffb);
    if (iVar8 < 2) {
      local_c = OKAY;
      RVar6 = local_c;
    }
    else {
      SPxLPBase<double>::nRows((SPxLPBase<double> *)0x27501d);
      DataArray<int>::DataArray
                ((DataArray<int> *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                 (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),(int)in_stack_fffffffffffff8b8,
                 (Real)in_stack_fffffffffffff8b0);
      SPxLPBase<double>::nRows((SPxLPBase<double> *)0x275043);
      DataArray<int>::DataArray
                ((DataArray<int> *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                 (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),(int)in_stack_fffffffffffff8b8,
                 (Real)in_stack_fffffffffffff8b0);
      SPxLPBase<double>::nRows((SPxLPBase<double> *)0x275079);
      Array<double>::Array
                ((Array<double> *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                 (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20));
      local_b0 = (int *)0x0;
      SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2750b1);
      spx_alloc<int*>((int **)in_stack_fffffffffffff8f0,
                      (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
      iVar8 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2751e8);
      IdxSet::IdxSet(&local_d8,iVar8,local_b0,0);
      piVar10 = DataArray<int>::operator[](&local_68,0);
      *piVar10 = 0;
      pdVar11 = Array<double>::operator[]
                          ((Array<double> *)in_stack_fffffffffffff8b0,
                           (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
      *pdVar11 = 0.0;
      iVar8 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x275255);
      piVar10 = DataArray<int>::operator[](&local_80,0);
      *piVar10 = iVar8;
      for (local_dc = 1; iVar8 = local_dc,
          iVar7 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x27529c), iVar8 < iVar7;
          local_dc = local_dc + 1) {
        piVar10 = DataArray<int>::operator[](&local_68,local_dc);
        *piVar10 = 0;
        pdVar11 = Array<double>::operator[]
                            ((Array<double> *)in_stack_fffffffffffff8b0,
                             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
        *pdVar11 = 0.0;
        piVar10 = DataArray<int>::operator[](&local_80,local_dc);
        *piVar10 = 0;
        IdxSet::addIdx(&local_d8,local_dc);
      }
      local_e8 = (element_type *)0x0;
      for (local_ec = 0; iVar8 = local_ec,
          iVar7 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x275398), iVar8 < iVar7;
          local_ec = local_ec + 1) {
        local_f8 = (SPxScaler<double> *)
                   SPxLPBase<double>::colVector
                             (in_stack_fffffffffffff8b0,
                              (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
        for (local_fc = 0; uVar4 = local_fc,
            iVar8 = SVectorBase<double>::size((SVectorBase<double> *)local_f8), (int)uVar4 < iVar8;
            local_fc = local_fc + 1) {
          pdVar11 = SVectorBase<double>::value((SVectorBase<double> *)local_f8,local_fc);
          local_108 = *pdVar11;
          pcVar12 = SVectorBase<double>::index
                              ((SVectorBase<double> *)local_f8,(char *)(ulong)local_fc,__c);
          local_10c = (int)pcVar12;
          pdVar11 = Array<double>::operator[]
                              ((Array<double> *)in_stack_fffffffffffff8b0,
                               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          dVar1 = local_108;
          if ((*pdVar11 == 0.0) && (!NAN(*pdVar11))) {
            pdVar11 = Array<double>::operator[]
                                ((Array<double> *)in_stack_fffffffffffff8b0,
                                 (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
            *pdVar11 = dVar1;
          }
          DataArray<int>::operator[](&local_68,local_10c);
          Array<soplex::DSVectorBase<double>_>::operator[]
                    ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0,
                     (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          dVar1 = local_108;
          pdVar11 = Array<double>::operator[]
                              ((Array<double> *)in_stack_fffffffffffff8b0,
                               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          local_118 = dVar1 / *pdVar11;
          DSVectorBase<double>::add
                    ((DSVectorBase<double> *)
                     CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                     (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
                     (double *)in_stack_fffffffffffff8b0);
          piVar10 = DataArray<int>::operator[](&local_68,local_10c);
          piVar10 = DataArray<int>::operator[](&local_80,*piVar10);
          iVar8 = *piVar10;
          *piVar10 = iVar8 + -1;
          if (iVar8 + -1 == 0) {
            piVar10 = DataArray<int>::operator[](&local_68,local_10c);
            IdxSet::addIdx(&local_d8,*piVar10);
          }
        }
        for (local_11c = 0; uVar4 = local_11c,
            iVar8 = SVectorBase<double>::size((SVectorBase<double> *)local_f8), (int)uVar4 < iVar8;
            local_11c = local_11c + 1) {
          pcVar12 = SVectorBase<double>::index
                              ((SVectorBase<double> *)local_f8,(char *)(ulong)local_11c,__c_00);
          pSVar13 = DataArray<int>::operator[](&local_68,(int)pcVar12);
          local_120 = *pSVar13;
          pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                              ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0,
                               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          iVar8 = SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
          if (0 < iVar8) {
            SPxSimplifier<double>::tolerances((SPxSimplifier<double> *)in_stack_fffffffffffff8a8);
            peVar15 = std::
                      __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x27567e);
            eps = Tolerances::epsilon(peVar15);
            ElementCompare::ElementCompare(&local_128,eps);
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x2756b6);
            pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0,
                                 (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
            iVar7 = SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
            iVar8 = extraout_EDX;
            if (1 < iVar7) {
              pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                  ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0
                                   ,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
              SVectorBase<double>::mem(&pDVar14->super_SVectorBase<double>);
              pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                  ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0
                                   ,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
              SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
              SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
                        (in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
                         in_stack_fffffffffffff8e0,in_stack_fffffffffffff8dc,
                         SUB41((uint)in_stack_fffffffffffff8d8 >> 0x18,0));
              iVar8 = extraout_EDX_00;
            }
            pcVar12 = IdxSet::index(&local_d8,(char *)0x0,iVar8);
            local_13c = (int)pcVar12;
            IdxSet::remove(&local_d8,(char *)0x0);
            local_140 = 0;
            while( true ) {
              uVar4 = local_140;
              pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                  ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0
                                   ,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
              iVar8 = SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
              iVar7 = (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
              if (iVar8 <= (int)uVar4) break;
              if (local_140 != 0) {
                pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                    ((Array<soplex::DSVectorBase<double>_> *)
                                     in_stack_fffffffffffff8b0,iVar7);
                SVectorBase<double>::value(&pDVar14->super_SVectorBase<double>,local_140);
                epsZero(in_stack_fffffffffffff8d0);
                bVar5 = NErel<double,double,double>
                                  ((double)in_stack_fffffffffffff8b0,
                                   (double)in_stack_fffffffffffff8a8,1.27398532272509e-317);
                if (bVar5) {
                  pcVar12 = IdxSet::index(&local_d8,(char *)0x0,__c_01);
                  local_13c = (int)pcVar12;
                  IdxSet::remove(&local_d8,(char *)0x0);
                }
              }
              iVar8 = local_13c;
              pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                  ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0
                                   ,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
              piVar10 = (int *)SVectorBase<double>::index
                                         (&pDVar14->super_SVectorBase<double>,
                                          (char *)(ulong)local_140,__c_02);
              piVar10 = DataArray<int>::operator[](&local_68,*piVar10);
              *piVar10 = iVar8;
              piVar10 = DataArray<int>::operator[](&local_80,local_13c);
              *piVar10 = *piVar10 + 1;
              pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                  ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0
                                   ,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
              pdVar11 = SVectorBase<double>::value(&pDVar14->super_SVectorBase<double>,local_140);
              local_e8 = (element_type *)*pdVar11;
              local_140 = local_140 + 1;
            }
            Array<soplex::DSVectorBase<double>_>::operator[]
                      ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0,iVar7);
            SVectorBase<double>::clear((SVectorBase<double> *)0x2759b1);
          }
        }
      }
      spx_free<int*>((int **)0x2759ee);
      SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2759fb);
      DataArray<bool>::DataArray
                ((DataArray<bool> *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                 (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),(int)in_stack_fffffffffffff8b8,
                 (Real)in_stack_fffffffffffff8b0);
      for (local_15c = 0; iVar8 = local_15c,
          iVar7 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x275a4a), iVar8 < iVar7;
          local_15c = local_15c + 1) {
        Array<soplex::DSVectorBase<double>_>::operator[]
                  ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0,
                   (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
        SVectorBase<double>::clear((SVectorBase<double> *)0x275a8c);
      }
      for (local_160 = 0; iVar8 = local_160,
          iVar7 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x275ade), iVar8 < iVar7;
          local_160 = local_160 + 1) {
        pbVar16 = DataArray<bool>::operator[](&local_158,local_160);
        *pbVar16 = false;
        DataArray<int>::operator[](&local_68,local_160);
        Array<soplex::DSVectorBase<double>_>::operator[]
                  ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0,
                   (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
        local_168 = (pointer)0x0;
        DSVectorBase<double>::add
                  ((DSVectorBase<double> *)
                   CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                   (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
                   (double *)in_stack_fffffffffffff8b0);
      }
      local_16c = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x275b9a);
      local_178._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      spx_alloc<int*>((int **)in_stack_fffffffffffff8f0,
                      (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
      for (local_17c = 0; local_17c < local_16c; local_17c = local_17c + 1) {
        *(undefined4 *)((long)&(local_178._M_pi)->_vptr__Sp_counted_base + (long)local_17c * 4) = 0;
      }
      local_180 = -1;
      local_184 = -1;
      local_188 = 0;
      for (local_18c = 0; iVar8 = local_18c,
          iVar7 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x275c5f), iVar8 < iVar7;
          local_18c = local_18c + 1) {
        pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                            ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0,
                             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
        iVar8 = SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
        if (1 < iVar8) {
          pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                              ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0,
                               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          SVectorBase<double>::index(&pDVar14->super_SVectorBase<double>,(char *)0x0,__c_03);
          pSVar17 = SPxLPBase<double>::rowVector
                              (in_stack_fffffffffffff8b0,
                               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          iVar8 = SVectorBase<double>::size(pSVar17);
          if (iVar8 != 1) {
            local_184 = local_18c;
            if (local_180 < 0) {
              local_180 = local_18c;
            }
            local_190 = 1;
            while( true ) {
              uVar4 = local_190;
              pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                  ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0
                                   ,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
              iVar8 = SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
              iVar7 = (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
              if (iVar8 <= (int)uVar4) break;
              pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                  ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0
                                   ,iVar7);
              piVar10 = (int *)SVectorBase<double>::index
                                         (&pDVar14->super_SVectorBase<double>,
                                          (char *)(ulong)local_190,__c_04);
              local_194 = *piVar10;
              *(undefined4 *)
               ((long)&(local_178._M_pi)->_vptr__Sp_counted_base + (long)local_194 * 4) = 0xffffffff
              ;
              local_190 = local_190 + 1;
            }
            pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0,
                                 iVar7);
            iVar8 = SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
            local_188 = iVar8 + -1 + local_188;
          }
        }
      }
      local_19c = 0;
      for (local_198 = 0; local_198 < local_16c; local_198 = local_198 + 1) {
        if (-1 < *(int *)((long)&(local_178._M_pi)->_vptr__Sp_counted_base + (long)local_198 * 4)) {
          *(int *)((long)&(local_178._M_pi)->_vptr__Sp_counted_base + (long)local_198 * 4) =
               local_19c;
          local_19c = local_19c + 1;
        }
      }
      local_19d = 0;
      SPxLPBase<double>::lhs((SPxLPBase<double> *)0x275ed4);
      VectorBase<double>::VectorBase
                ((VectorBase<double> *)in_stack_fffffffffffff8b0,
                 (VectorBase<double> *)in_stack_fffffffffffff8a8);
      SPxLPBase<double>::rhs((SPxLPBase<double> *)0x275f02);
      VectorBase<double>::VectorBase
                ((VectorBase<double> *)in_stack_fffffffffffff8b0,
                 (VectorBase<double> *)in_stack_fffffffffffff8a8);
      local_1d4 = 0;
      while( true ) {
        iVar8 = local_1d4;
        iVar7 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x275f49);
        n = (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20);
        if (iVar7 <= iVar8) break;
        pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                            ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0,
                             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
        iVar8 = SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
        if (1 < iVar8) {
          pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                              ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0,
                               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          SVectorBase<double>::index(&pDVar14->super_SVectorBase<double>,(char *)0x0,__c_05);
          pSVar17 = SPxLPBase<double>::rowVector
                              (in_stack_fffffffffffff8b0,
                               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          iVar8 = SVectorBase<double>::size(pSVar17);
          if (iVar8 != 1) {
            pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0,
                                 (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
            local_1d8 = SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
            SPxOut::debug<soplex::SPxMainSM<double>,_const_char_(&)[34],_int,_0>
                      (in_RDI,(char (*) [34])"IMAISM53 {} duplicate rows found\n",&local_1d8);
            pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0,
                                 (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
            iVar8 = SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
            piVar10 = DataArray<int>::operator[](&in_RDI->m_stat,0xc);
            *piVar10 = iVar8 + -1 + *piVar10;
            local_1dc = -1;
            local_1e0 = -1;
            local_1e4 = -1;
            puVar18 = (ulong *)infinity();
            local_1f0 = (pointer)(*puVar18 ^ (ulong)DAT_007e31b0);
            pdVar11 = (double *)infinity();
            local_1f8 = (pointer)*pdVar11;
            pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0,
                                 (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
            SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
            DataArray<bool>::DataArray
                      ((DataArray<bool> *)
                       CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                       (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
                       (int)in_stack_fffffffffffff8b8,(Real)in_stack_fffffffffffff8b0);
            local_214 = 0;
            while( true ) {
              uVar4 = local_214;
              pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                  ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0
                                   ,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
              iVar8 = SVectorBase<double>::size(&pDVar14->super_SVectorBase<double>);
              pDVar19 = local_1f0;
              iVar7 = (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
              if (iVar8 <= (int)uVar4) break;
              pDVar14 = Array<soplex::DSVectorBase<double>_>::operator[]
                                  ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0
                                   ,iVar7);
              piVar10 = (int *)SVectorBase<double>::index
                                         (&pDVar14->super_SVectorBase<double>,
                                          (char *)(ulong)local_214,__c_06);
              local_218 = *piVar10;
              pdVar11 = SPxLPBase<double>::lhs
                                  (in_stack_fffffffffffff8b0,
                                   (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
              dVar1 = *pdVar11;
              pdVar11 = SPxLPBase<double>::rhs
                                  (in_stack_fffffffffffff8b0,
                                   (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
              dVar2 = *pdVar11;
              pbVar16 = DataArray<bool>::operator[](&local_210,local_214);
              *pbVar16 = dVar1 == dVar2;
              iVar8 = (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
              if (local_1dc == -1) {
                local_1dc = local_218;
                pdVar11 = SPxLPBase<double>::lhs(in_stack_fffffffffffff8b0,iVar8);
                local_1f0 = (pointer)*pdVar11;
                pdVar11 = SPxLPBase<double>::rhs
                                    (in_stack_fffffffffffff8b0,
                                     (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
                local_1f8 = (pointer)*pdVar11;
              }
              else {
                pdVar11 = Array<double>::operator[]
                                    ((Array<double> *)in_stack_fffffffffffff8b0,iVar8);
                dVar1 = *pdVar11;
                pdVar11 = Array<double>::operator[]
                                    ((Array<double> *)in_stack_fffffffffffff8b0,
                                     (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
                local_230 = (pointer)(dVar1 / *pdVar11);
                iVar8 = (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
                if ((double)local_230 <= 0.0) {
                  pdVar11 = SPxLPBase<double>::rhs(in_stack_fffffffffffff8b0,iVar8);
                  dVar1 = *pdVar11;
                  pdVar11 = (double *)infinity();
                  if (dVar1 < *pdVar11) {
                    pdVar11 = SPxLPBase<double>::rhs
                                        (in_stack_fffffffffffff8b0,
                                         (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
                    local_570 = (pointer)(*pdVar11 * (double)local_230);
                  }
                  else {
                    pdVar11 = (double *)infinity();
                    local_570 = (pointer)((ulong)*pdVar11 ^ 0x8000000000000000);
                  }
                  local_220 = local_570;
                  pdVar11 = SPxLPBase<double>::lhs
                                      (in_stack_fffffffffffff8b0,
                                       (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
                  dVar1 = *pdVar11;
                  pdVar11 = (double *)infinity();
                  if (-*pdVar11 < dVar1) {
                    pdVar11 = SPxLPBase<double>::lhs
                                        (in_stack_fffffffffffff8b0,
                                         (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
                    local_590 = (pointer)(*pdVar11 * (double)local_230);
                  }
                  else {
                    pdVar11 = (double *)infinity();
                    local_590 = (pointer)*pdVar11;
                  }
                  local_228 = local_590;
                }
                else {
                  pdVar11 = SPxLPBase<double>::lhs(in_stack_fffffffffffff8b0,iVar8);
                  dVar1 = *pdVar11;
                  pdVar11 = (double *)infinity();
                  if (-*pdVar11 < dVar1) {
                    pdVar11 = SPxLPBase<double>::lhs
                                        (in_stack_fffffffffffff8b0,
                                         (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
                    local_530 = (pointer)(*pdVar11 * (double)local_230);
                  }
                  else {
                    pdVar11 = (double *)infinity();
                    local_530 = (pointer)((ulong)*pdVar11 ^ 0x8000000000000000);
                  }
                  local_220 = local_530;
                  pdVar11 = SPxLPBase<double>::rhs
                                      (in_stack_fffffffffffff8b0,
                                       (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
                  dVar1 = *pdVar11;
                  pdVar11 = (double *)infinity();
                  if (dVar1 < *pdVar11) {
                    pdVar11 = SPxLPBase<double>::rhs
                                        (in_stack_fffffffffffff8b0,
                                         (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
                    local_550 = (pointer)(*pdVar11 * (double)local_230);
                  }
                  else {
                    pdVar11 = (double *)infinity();
                    local_550 = (pointer)*pdVar11;
                  }
                  local_228 = local_550;
                }
                if ((double)local_1f0 < (double)local_220) {
                  local_1f0 = local_220;
                  local_1e0 = local_218;
                }
                if ((double)local_228 < (double)local_1f8) {
                  local_1f8 = local_228;
                  local_1e4 = local_218;
                }
                pbVar16 = DataArray<bool>::operator[](&local_158,local_218);
                *pbVar16 = true;
              }
              local_214 = local_214 + 1;
            }
            if (local_1dc == -1) {
LAB_0027729b:
              local_378 = 0;
            }
            else {
              pdVar11 = SPxLPBase<double>::lhs(in_stack_fffffffffffff8b0,iVar7);
              if ((double)pDVar19 < *pdVar11 || (double)pDVar19 == *pdVar11) {
                pdVar11 = SPxLPBase<double>::lhs
                                    (in_stack_fffffffffffff8b0,
                                     (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
                local_5b0 = (pointer)*pdVar11;
              }
              else {
                local_5b0 = local_1f0;
              }
              local_238 = local_5b0;
              pDVar20 = local_1f8;
              pdVar11 = SPxLPBase<double>::rhs
                                  (in_stack_fffffffffffff8b0,
                                   (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
              pDVar19 = local_1f8;
              if (*pdVar11 <= (double)pDVar20) {
                pdVar11 = SPxLPBase<double>::rhs
                                    (in_stack_fffffffffffff8b0,
                                     (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
                pDVar19 = (pointer)*pdVar11;
              }
              iVar8 = (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20);
              local_240 = pDVar19;
              if (local_1d4 == local_184) {
                DataArray<int>::DataArray
                          ((DataArray<int> *)
                           CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),iVar8,
                           (int)in_stack_fffffffffffff8b8,(Real)in_stack_fffffffffffff8b0);
                for (local_25c = 0; local_25c < local_16c; local_25c = local_25c + 1) {
                  iVar8 = *(int *)((long)&(local_178._M_pi)->_vptr__Sp_counted_base +
                                  (long)local_25c * 4);
                  piVar10 = DataArray<int>::operator[](&local_258,local_25c);
                  *piVar10 = iVar8;
                }
                operator_new(0xd0);
                local_2d9 = 1;
                in_stack_fffffffffffffa08 = local_1e0;
                in_stack_fffffffffffffa0c = local_1e4;
                Array<soplex::DSVectorBase<double>_>::operator[]
                          ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0,
                           (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
                Array<double>::Array
                          ((Array<double> *)
                           CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                           (Array<double> *)in_stack_fffffffffffff8b8);
                DataArray<int>::DataArray
                          ((DataArray<int> *)
                           CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                           (DataArray<int> *)in_stack_fffffffffffff8b8);
                DataArray<bool>::DataArray
                          ((DataArray<bool> *)
                           CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                           in_stack_fffffffffffff8b8);
                in_stack_fffffffffffff9e8 = (DataArray<int> *)(local_2d8 + 0x10);
                in_stack_fffffffffffff9e0 = local_240;
                SPxSimplifier<double>::tolerances
                          ((SPxSimplifier<double> *)in_stack_fffffffffffff8a8);
                peVar15 = std::
                          __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x276a28);
                in_stack_fffffffffffff9f0 = (DataArray<bool> *)Tolerances::epsilon(peVar15);
                EQrel<double,double,double>
                          ((double)in_stack_fffffffffffff8b0,(double)in_stack_fffffffffffff8a8,
                           1.27623628580755e-317);
                this_00 = (SPxMainSM<double> *)local_2d8;
                std::shared_ptr<soplex::Tolerances>::shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff8b0,
                           (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff8a8);
                in_stack_fffffffffffff8b8 = &local_2b8;
                in_stack_fffffffffffff8b0 = (SPxLPBase<double> *)local_2a0;
                in_stack_fffffffffffff8a8 = (DuplicateRowsPS *)(local_2a0 + 0x18);
                in_stack_fffffffffffff8c0 = 1;
                DuplicateRowsPS::DuplicateRowsPS
                          (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                           in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0,
                           in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a0,
                           (Array<double> *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9e8,
                           in_stack_fffffffffffff9f0,
                           SUB81((ulong)in_stack_fffffffffffff998 >> 0x38,0),
                           SUB81((ulong)in_stack_fffffffffffff998 >> 0x30,0),
                           (shared_ptr<soplex::Tolerances> *)
                           CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                           SUB81((ulong)in_stack_fffffffffffff998 >> 0x28,0));
                local_2d9 = 0;
                std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::
                shared_ptr<soplex::SPxMainSM<double>::DuplicateRowsPS,void>
                          ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                           in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
                std::shared_ptr<soplex::Tolerances>::~shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)0x276b4c);
                std::shared_ptr<soplex::Tolerances>::~shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)0x276b59);
                DataArray<bool>::~DataArray((DataArray<bool> *)in_stack_fffffffffffff8b0);
                DataArray<int>::~DataArray((DataArray<int> *)in_stack_fffffffffffff8b0);
                Array<double>::~Array((Array<double> *)0x276b80);
                Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::append
                          ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
                           in_stack_fffffffffffff8b0,
                           (shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                           in_stack_fffffffffffff8a8);
                std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::~shared_ptr
                          ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)0x276bab);
                DataArray<int>::~DataArray((DataArray<int> *)in_stack_fffffffffffff8b0);
              }
              else {
                DataArray<int>::DataArray
                          ((DataArray<int> *)
                           CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),iVar8,
                           (int)in_stack_fffffffffffff8b8,(Real)in_stack_fffffffffffff8b0);
                in_stack_fffffffffffff9c0 = (DuplicateRowsPS *)operator_new(0xd0);
                local_371 = 1;
                in_stack_fffffffffffff9a0 = local_20;
                in_stack_fffffffffffff9ac = local_1dc;
                in_stack_fffffffffffff9b0 = local_1e0;
                in_stack_fffffffffffff9b4 = local_1e4;
                in_stack_fffffffffffff9b8 =
                     (SPxLPBase<double> *)
                     Array<soplex::DSVectorBase<double>_>::operator[]
                               ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffff8b0,
                                (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
                Array<double>::Array
                          ((Array<double> *)
                           CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                           (Array<double> *)in_stack_fffffffffffff8b8);
                DataArray<int>::DataArray
                          ((DataArray<int> *)
                           CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                           (DataArray<int> *)in_stack_fffffffffffff8b8);
                DataArray<bool>::DataArray
                          ((DataArray<bool> *)
                           CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                           in_stack_fffffffffffff8b8);
                SPxSimplifier<double>::tolerances
                          ((SPxSimplifier<double> *)in_stack_fffffffffffff8a8);
                peVar15 = std::
                          __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x276e00);
                in_stack_fffffffffffff998 = Tolerances::epsilon(peVar15);
                EQrel<double,double,double>
                          ((double)in_stack_fffffffffffff8b0,(double)in_stack_fffffffffffff8a8,
                           1.27672244640305e-317);
                this_00 = (SPxMainSM<double> *)local_370;
                std::shared_ptr<soplex::Tolerances>::shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff8b0,
                           (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff8a8);
                in_stack_fffffffffffff8b8 = (DataArray<bool> *)(local_370 + 0x20);
                in_stack_fffffffffffff8b0 = (SPxLPBase<double> *)local_338;
                in_stack_fffffffffffff8a8 = (DuplicateRowsPS *)(local_338 + 0x18);
                in_stack_fffffffffffff8c0 = 0;
                DuplicateRowsPS::DuplicateRowsPS
                          (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                           in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0,
                           in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a0,
                           (Array<double> *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9e8,
                           in_stack_fffffffffffff9f0,
                           SUB81((ulong)in_stack_fffffffffffff998 >> 0x38,0),
                           SUB81((ulong)in_stack_fffffffffffff998 >> 0x30,0),
                           (shared_ptr<soplex::Tolerances> *)
                           CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                           SUB81((ulong)in_stack_fffffffffffff998 >> 0x28,0));
                local_371 = 0;
                std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::
                shared_ptr<soplex::SPxMainSM<double>::DuplicateRowsPS,void>
                          ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                           in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
                std::shared_ptr<soplex::Tolerances>::~shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)0x276f24);
                std::shared_ptr<soplex::Tolerances>::~shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)0x276f31);
                DataArray<bool>::~DataArray((DataArray<bool> *)in_stack_fffffffffffff8b0);
                DataArray<int>::~DataArray((DataArray<int> *)in_stack_fffffffffffff8b0);
                Array<double>::~Array((Array<double> *)0x276f58);
                Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::append
                          ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
                           in_stack_fffffffffffff8b0,
                           (shared_ptr<soplex::SPxMainSM<double>::PostStep> *)
                           in_stack_fffffffffffff8a8);
                std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::~shared_ptr
                          ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)0x276f83);
                DataArray<int>::~DataArray((DataArray<int> *)in_stack_fffffffffffff8b0);
              }
              pDVar20 = local_1f0;
              pdVar11 = SPxLPBase<double>::lhs
                                  (in_stack_fffffffffffff8b0,
                                   (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
              pDVar19 = local_1f8;
              if (((double)pDVar20 < *pdVar11 || (double)pDVar20 == *pdVar11) &&
                 (pdVar11 = SPxLPBase<double>::rhs
                                      (in_stack_fffffffffffff8b0,
                                       (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20)),
                 *pdVar11 <= (double)pDVar19)) goto LAB_0027729b;
              local_19d = 1;
              feastol(this_00);
              bVar5 = LTrel<double,double,double>
                                ((double)in_stack_fffffffffffff8b0,(double)in_stack_fffffffffffff8a8
                                 ,1.27716117669656e-317);
              pDVar19 = local_238;
              if (!bVar5) {
                if ((double)local_240 < (double)local_238) {
                  local_240 = local_238;
                }
                pdVar11 = VectorBase<double>::operator[]
                                    ((VectorBase<double> *)in_stack_fffffffffffff8b0,
                                     (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
                pDVar20 = local_240;
                *pdVar11 = (double)pDVar19;
                pdVar11 = VectorBase<double>::operator[]
                                    ((VectorBase<double> *)in_stack_fffffffffffff8b0,
                                     (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
                *pdVar11 = (double)pDVar20;
                goto LAB_0027729b;
              }
              SPxOut::debug<soplex::SPxMainSM<double>,_const_char_(&)[64],_double_&,_double_&,_0>
                        (in_RDI,(char (*) [64])
                                "IMAISM55 duplicate rows yield infeasible bounds: lhs={} rhs={}\n",
                         (double *)&local_238,(double *)&local_240);
              spx_free<int*>((int **)0x2771f4);
              local_c = INFEASIBLE;
              local_378 = 1;
            }
            DataArray<bool>::~DataArray((DataArray<bool> *)in_stack_fffffffffffff8b0);
            if (local_378 != 0) goto LAB_0027769f;
          }
        }
        local_1d4 = local_1d4 + 1;
      }
      if ((local_19d & 1) != 0) {
        (*local_20->_vptr_DSVectorBase[0x38])(local_20,local_1b8,local_1d0,0);
      }
      local_37c = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x277331);
      local_388 = 0;
      spx_alloc<int*>((int **)in_stack_fffffffffffff8f0,n);
      for (local_38c = 0; local_38c < local_37c; local_38c = local_38c + 1) {
        pbVar16 = DataArray<bool>::operator[](&local_158,local_38c);
        if ((*pbVar16 & 1U) == 0) {
          *(undefined4 *)(local_388 + (long)local_38c * 4) = 0;
        }
        else {
          *(undefined4 *)(local_388 + (long)local_38c * 4) = 0xffffffff;
          local_2c = local_2c + 1;
          pSVar17 = SPxLPBase<double>::rowVector
                              (in_stack_fffffffffffff8b0,
                               (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          iVar8 = SVectorBase<double>::size(pSVar17);
          local_30 = iVar8 + local_30;
        }
      }
      (*local_20->_vptr_DSVectorBase[0x11])(local_20,local_388);
      for (local_390 = 0; local_390 < local_37c; local_390 = local_390 + 1) {
        if (-1 < *(int *)(local_388 + (long)local_390 * 4)) {
          piVar10 = DataArray<int>::operator[](&in_RDI->m_rIdx,local_390);
          iVar8 = *piVar10;
          piVar10 = DataArray<int>::operator[]
                              (&in_RDI->m_rIdx,*(int *)(local_388 + (long)local_390 * 4));
          *piVar10 = iVar8;
        }
      }
      spx_free<int*>((int **)0x2774e9);
      spx_free<int*>((int **)0x2774f6);
      if (0 < local_2c + local_30) {
        (in_RDI->super_SPxSimplifier<double>).m_remRows =
             local_2c + (in_RDI->super_SPxSimplifier<double>).m_remRows;
        (in_RDI->super_SPxSimplifier<double>).m_remNzos =
             local_30 + (in_RDI->super_SPxSimplifier<double>).m_remNzos;
        if (((in_RDI->super_SPxSimplifier<double>).spxout != (SPxOut *)0x0) &&
           (VVar9 = SPxOut::getVerbosity((in_RDI->super_SPxSimplifier<double>).spxout),
           3 < (int)VVar9)) {
          local_394 = SPxOut::getVerbosity((in_RDI->super_SPxSimplifier<double>).spxout);
          pSVar3 = (in_RDI->super_SPxSimplifier<double>).spxout;
          local_398 = 4;
          (*pSVar3->_vptr_SPxOut[2])(pSVar3,&local_398);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffff8b0,
                             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          soplex::operator<<((SPxOut *)in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffff8b0,
                             (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          soplex::operator<<((SPxOut *)in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffff8b0,
                             (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff8a8);
          pSVar3 = (in_RDI->super_SPxSimplifier<double>).spxout;
          (*pSVar3->_vptr_SPxOut[2])(pSVar3,&local_394);
        }
        if ((in_RDI->super_SPxSimplifier<double>).m_minReduction * (double)local_34 <
            (double)local_2c) {
          *local_28 = 1;
        }
      }
      local_c = OKAY;
      local_378 = 1;
LAB_0027769f:
      VectorBase<double>::~VectorBase((VectorBase<double> *)0x2776ac);
      VectorBase<double>::~VectorBase((VectorBase<double> *)0x2776b9);
      DataArray<bool>::~DataArray((DataArray<bool> *)in_stack_fffffffffffff8b0);
      IdxSet::~IdxSet((IdxSet *)in_stack_fffffffffffff8b0);
      Array<double>::~Array((Array<double> *)0x2776e0);
      DataArray<int>::~DataArray((DataArray<int> *)in_stack_fffffffffffff8b0);
      DataArray<int>::~DataArray((DataArray<int> *)in_stack_fffffffffffff8b0);
      RVar6 = local_c;
    }
  }
  local_c = RVar6;
  return local_c;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateRows(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate rows
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   // Possible extension: use generalized definition of duplicate rows according to Andersen and Andersen
   // However: the resulting sparsification is often very small since the involved rows are usually very sparse

   int remRows = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

#if SOPLEX_ROW_SINGLETON
   int rs_remRows = 0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 1)
      {
         removeRowSingleton(lp, row, i);
         rs_remRows++;
      }
   }

   if(rs_remRows > 0)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) <<
                    "Simplifier duplicate rows (row singleton stage) removed "
                    << rs_remRows << " rows, "
                    << rs_remRows << " non-zeros"
                    << std::endl;)
   }

#endif

   if(lp.nRows() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nRows());           // class of parallel rows
   DataArray<int>    classSize(lp.nRows());        // size of each class
   Array<R>   scale(lp.nRows());            // scaling factor for each row
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nRows());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nRows(), idxMem);           // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nRows();

   for(int i = 1; i < lp.nRows(); ++i)
   {
      pClass[i] = 0;
      scale[i]  = 0.0;
      classSize[i] = 0;
      idxSet.addIdx(i);
   }

   R oldVal = 0.0;

   // main loop
   for(int j = 0; j < lp.nCols(); ++j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);
         int  i   = col.index(k);

         if(scale[i] == 0.0)
            scale[i] = aij;

         m_classSetRows[pClass[i]].add(i, aij / scale[i]);

         if(--classSize[pClass[i]] == 0)
            idxSet.addIdx(pClass[i]);
      }

      // update each parallel class with non-zero column entry
      for(int m = 0; m < col.size(); ++m)
      {
         int k = pClass[col.index(m)];

         if(m_classSetRows[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled column values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetRows[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetRows[k].hasNaNs());
               assert(!m_classSetRows[k].hasInfs());
               SPxQuicksort(m_classSetRows[k].mem(), m_classSetRows[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetRows[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetRows[k].value(l), oldVal, this->epsZero()))
               {
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetRows[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetRows[k].value(l);
            }

            m_classSetRows[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remRow(lp.nRows());

   for(int k = 0; k < lp.nRows(); ++k)
      m_dupRows[k].clear();

   for(int k = 0; k < lp.nRows(); ++k)
   {
      remRow[k] = false;
      m_dupRows[pClass[k]].add(k, 0.0);
   }

   const int nRowsOld_tmp = lp.nRows();
   int* perm_tmp = nullptr;
   spx_alloc(perm_tmp, nRowsOld_tmp);

   for(int j = 0; j < nRowsOld_tmp; ++j)
   {
      perm_tmp[j] = 0;
   }

   int idxFirstDupRows = -1;
   int idxLastDupRows = -1;
   int numDelRows = 0;

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         idxLastDupRows = k;

         if(idxFirstDupRows < 0)
         {
            idxFirstDupRows = k;
         }

         for(int l = 1; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            perm_tmp[i] = -1;
         }

         numDelRows += (m_dupRows[k].size() - 1);
      }
   }

   {
      int k_tmp, j_tmp = -1;

      for(k_tmp = j_tmp = 0; k_tmp < nRowsOld_tmp; ++k_tmp)
      {
         if(perm_tmp[k_tmp] >= 0)
            perm_tmp[k_tmp] = j_tmp++;
      }
   }

   // store rhs and lhs changes for combined update
   bool doChangeRanges = false;
   VectorBase<R> newLhsVec(lp.lhs());
   VectorBase<R> newRhsVec(lp.rhs());

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM53 {} duplicate rows found\n", m_dupRows[k].size());

         m_stat[DUPLICATE_ROW] += m_dupRows[k].size() - 1;

         // index of one non-column singleton row in dupRows[k]
         int  rowIdx    = -1;
         int  maxLhsIdx = -1;
         int  minRhsIdx = -1;
         R maxLhs    = R(-infinity);
         R minRhs    = +R(infinity);

         DataArray<bool> isLhsEqualRhs(m_dupRows[k].size());

         // determine strictest bounds on constraint
         for(int l = 0; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            isLhsEqualRhs[l] = (lp.lhs(i) == lp.rhs(i));

            SOPLEX_ASSERT_WARN("WMAISM54", isNotZero(scale[i], R(1.0 / R(infinity))));

            if(rowIdx == -1)
            {
               rowIdx = i;
               maxLhs = lp.lhs(rowIdx);
               minRhs = lp.rhs(rowIdx);
            }
            else
            {
               R scaledLhs, scaledRhs;
               R factor = scale[rowIdx] / scale[i];

               if(factor > 0)
               {
                  scaledLhs = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) * factor;
                  scaledRhs = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) * factor;
               }
               else
               {
                  scaledLhs = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) * factor;
                  scaledRhs = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) * factor;
               }

               if(scaledLhs > maxLhs)
               {
                  maxLhs    = scaledLhs;
                  maxLhsIdx = i;
               }

               if(scaledRhs < minRhs)
               {
                  minRhs    = scaledRhs;
                  minRhsIdx = i;
               }

               remRow[i] = true;
            }
         }

         if(rowIdx != -1)
         {
            R newLhs = (maxLhs > lp.lhs(rowIdx)) ? maxLhs : lp.lhs(rowIdx);
            R newRhs = (minRhs < lp.rhs(rowIdx)) ? minRhs : lp.rhs(rowIdx);

            if(k == idxLastDupRows)
            {
               DataArray<int> da_perm(nRowsOld_tmp);

               for(int j = 0; j < nRowsOld_tmp; ++j)
               {
                  da_perm[j] = perm_tmp[j];
               }

               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm, isLhsEqualRhs, true,
                                             EQrel(newLhs, newRhs, this->tolerances()->epsilon()), this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }
            else
            {
               DataArray<int> da_perm_empty(0);
               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm_empty, isLhsEqualRhs, false, EQrel(newLhs, newRhs,
                                                   this->tolerances()->epsilon()),
                                             this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }

            if(maxLhs > lp.lhs(rowIdx) || minRhs < lp.rhs(rowIdx))
            {
               // modify lhs and rhs of constraint rowIdx
               doChangeRanges = true;

               if(LTrel(newRhs, newLhs, feastol()))
               {
                  SPxOut::debug(this, "IMAISM55 duplicate rows yield infeasible bounds: lhs={} rhs={}\n", newLhs,
                                newRhs);
                  spx_free(perm_tmp);
                  return this->INFEASIBLE;
               }

               // if we accept the infeasibility we should clean up the values to avoid problems later
               if(newRhs < newLhs)
                  newRhs = newLhs;

               newLhsVec[rowIdx] = newLhs;
               newRhsVec[rowIdx] = newRhs;
            }
         }
      }
   }

   // change ranges for all modified constraints by one single call (more efficient)
   if(doChangeRanges)
   {
      lp.changeRange(newLhsVec, newRhsVec);
   }

   // remove all rows by one single method call (more efficient)
   const int nRowsOld = lp.nRows();
   int* perm = nullptr;
   spx_alloc(perm, nRowsOld);

   for(int i = 0; i < nRowsOld; ++i)
   {
      if(remRow[i])
      {
         perm[i] = -1;
         ++remRows;
         remNzos += lp.rowVector(i).size();
      }
      else
         perm[i] = 0;
   }

   lp.removeRows(perm);

   for(int i = 0; i < nRowsOld; ++i)
   {
      // assert that the pre-computed permutation was correct
      assert(perm[i] == perm_tmp[i]);

      // update the global index mapping
      if(perm[i] >= 0)
         m_rIdx[perm[i]] = m_rIdx[i];
   }

   spx_free(perm);
   spx_free(perm_tmp);

   if(remRows + remNzos > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate rows) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remRows > this->m_minReduction * oldRows)
         again = true;

   }

   return this->OKAY;
}